

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

Data * __thiscall QUtcTimeZonePrivate::data(QUtcTimeZonePrivate *this,TimeType timeType)

{
  undefined4 in_EDX;
  Data *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  QDateTime::currentMSecsSinceEpoch();
  data((QUtcTimeZonePrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(qint64)in_RDI);
  return in_RDI;
}

Assistant:

QTimeZonePrivate::Data QUtcTimeZonePrivate::data(QTimeZone::TimeType timeType) const
{
    Q_UNUSED(timeType);
    return data(QDateTime::currentMSecsSinceEpoch());
}